

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O0

void __thiscall Restaurant::start(Restaurant *this)

{
  bool bVar1;
  bool bVar2;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [8];
  string action1;
  string local_78 [8];
  string token;
  size_t pos;
  allocator local_39;
  string local_38 [8];
  string delimiter;
  bool restOpen;
  Restaurant *this_local;
  
  std::operator<<((ostream *)&std::cout,"Restaurant is now open!\n");
  bVar1 = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38," ",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::string(local_78);
  while (bVar1) {
    std::__cxx11::string::string(local_98);
    std::operator<<((ostream *)&std::cout,"Please enter an Action you want to do: \n");
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_98);
    std::__cxx11::string::operator+=(local_98," ");
    std::__cxx11::string::find(local_98,(ulong)local_38);
    std::__cxx11::string::substr((ulong)local_b8,(ulong)local_98);
    std::__cxx11::string::operator=(local_78,local_b8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)local_98,0);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,"open");
    if (bVar2) {
      std::__cxx11::string::string(local_d8,local_98);
      goOpen(this,(string *)local_d8);
      std::__cxx11::string::~string(local_d8);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_78,"order");
      if (bVar2) {
        std::__cxx11::string::string(local_f8,local_98);
        goOrder(this,(string *)local_f8);
        std::__cxx11::string::~string(local_f8);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_78,"move");
        if (bVar2) {
          std::__cxx11::string::string(local_118,local_98);
          goMove(this,(string *)local_118);
          std::__cxx11::string::~string(local_118);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_78,"close");
          if (bVar2) {
            std::__cxx11::string::string(local_138,local_98);
            goClose(this,(string *)local_138);
            std::__cxx11::string::~string(local_138);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_78,"closeall");
            if (bVar2) {
              goCloseAll(this);
              bVar1 = false;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_78,"menu");
              if (bVar2) {
                goMenu(this);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_78,"status");
                if (bVar2) {
                  std::__cxx11::string::string(local_158,local_98);
                  goStatus(this,(string *)local_158);
                  std::__cxx11::string::~string(local_158);
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_78,"log");
                  if (bVar2) {
                    goLog(this);
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_78,"backup");
                    if (bVar2) {
                      goBackup(this);
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_78,"restore");
                      if (bVar2) {
                        goRestore(this);
                      }
                      else {
                        std::operator<<((ostream *)&std::cout,"Wrong input, try again \n");
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_98);
  }
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Restaurant::start()
{
    std::cout << "Restaurant is now open!\n";
    bool restOpen(true);
    //std::string action;
    std::string delimiter = " ";
    size_t pos = 0;
    std::string token;
    while (restOpen)
    {
        std::string action1;
        std::cout << "Please enter an Action you want to do: \n";
        std::getline(std::cin, action1);
        action1 += " ";
        pos = action1.find(delimiter);
        token = action1.substr(0, pos);
        action1.erase(0, pos + delimiter.length());
        if(token == "open")
            goOpen(action1);
        else if(token == "order")
            goOrder(action1);
        else if(token == "move")
            goMove(action1);
        else if(token == "close")
            goClose(action1);
        else if (token == "closeall") {
            goCloseAll();
            restOpen = false;
        }
        else if (token == "menu")
            goMenu();
        else if (token == "status")
            goStatus(action1);
        else if (token == "log")
            goLog();
        else if (token == "backup")
            goBackup();
        else if (token == "restore")
            goRestore();
        else
            std::cout << "Wrong input, try again \n";
    }
}